

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testGccDepfileReader.cxx
# Opt level: O1

bool anon_unknown.dwarf_a244b::compare
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *actual,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *expected,char *msg)

{
  size_t *psVar1;
  pointer pbVar2;
  pointer pbVar3;
  pointer pbVar4;
  int iVar5;
  size_t sVar6;
  ostream *poVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  
  pbVar2 = (actual->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (actual->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  lVar8 = (long)pbVar3 - (long)pbVar2;
  pbVar4 = (expected->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (lVar8 == (long)(expected->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4) {
    bVar11 = pbVar3 == pbVar2;
    if (bVar11) {
      return bVar11;
    }
    uVar9 = lVar8 >> 5;
    sVar6 = pbVar2->_M_string_length;
    if (sVar6 == pbVar4->_M_string_length) {
      uVar10 = 1;
      lVar8 = 0;
      do {
        if ((sVar6 != 0) &&
           (iVar5 = bcmp(*(void **)((long)&(pbVar2->_M_dataplus)._M_p + lVar8),
                         *(void **)((long)&(pbVar4->_M_dataplus)._M_p + lVar8),sVar6), iVar5 != 0))
        break;
        bVar11 = uVar9 <= uVar10;
        if (uVar9 + (uVar9 == 0) == uVar10) {
          return bVar11;
        }
        sVar6 = *(size_t *)((long)&pbVar2[1]._M_string_length + lVar8);
        uVar10 = uVar10 + 1;
        psVar1 = (size_t *)((long)&pbVar4[1]._M_string_length + lVar8);
        lVar8 = lVar8 + 0x20;
      } while (sVar6 == *psVar1);
      lVar8 = uVar10 - 1;
    }
    else {
      lVar8 = 0;
    }
    if (msg == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0xc14760);
    }
    else {
      sVar6 = strlen(msg);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,msg,sVar6);
    }
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '`');
    std::ostream::put('`');
    poVar7 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"expected: ",10);
    pbVar2 = (expected->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,pbVar2[lVar8]._M_dataplus._M_p,pbVar2[lVar8]._M_string_length);
    std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
    std::ostream::put((char)poVar7);
    poVar7 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"actual: ",8);
    pbVar2 = (actual->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,pbVar2[lVar8]._M_dataplus._M_p,pbVar2[lVar8]._M_string_length);
  }
  else {
    if (msg == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0xc14760);
    }
    else {
      sVar6 = strlen(msg);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,msg,sVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"expected ",9);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," entries.",9);
    std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
    std::ostream::put((char)poVar7);
    poVar7 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"Actual number of entries: ",0x1a);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    bVar11 = false;
  }
  std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  return bVar11;
}

Assistant:

bool compare(const std::vector<std::string>& actual,
             const std::vector<std::string>& expected, const char* msg)
{
  if (actual.size() != expected.size()) {
    std::cerr << msg << "expected " << expected.size() << " entries."
              << std::endl
              << "Actual number of entries: " << actual.size() << std::endl;
    return false;
  }
  for (std::size_t i = 0; i < actual.size(); ++i) {
    if (actual[i] != expected[i]) {
      std::cerr << msg << std::endl
                << "expected: " << expected[i] << std::endl
                << "actual: " << actual[i] << std::endl;
      return false;
    }
  }
  return true;
}